

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_data_resp(Curl_easy *data,int smtpcode,smtpstate instate)

{
  CURLcode local_1c;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  Curl_easy *data_local;
  
  local_1c = CURLE_OK;
  if (smtpcode == 0x162) {
    Curl_pgrsSetUploadSize(data,(data->state).infilesize);
    Curl_xfer_setup1(data,2,-1,false);
    smtp_state(data,SMTP_STOP);
  }
  else {
    Curl_failf(data,"DATA failed: %d",(ulong)(uint)smtpcode);
    local_1c = CURLE_SEND_ERROR;
  }
  return local_1c;
}

Assistant:

static CURLcode smtp_state_data_resp(struct Curl_easy *data, int smtpcode,
                                     smtpstate instate)
{
  CURLcode result = CURLE_OK;
  (void)instate; /* no use for this yet */

  if(smtpcode != 354) {
    failf(data, "DATA failed: %d", smtpcode);
    result = CURLE_SEND_ERROR;
  }
  else {
    /* Set the progress upload size */
    Curl_pgrsSetUploadSize(data, data->state.infilesize);

    /* SMTP upload */
    Curl_xfer_setup1(data, CURL_XFER_SEND, -1, FALSE);

    /* End of DO phase */
    smtp_state(data, SMTP_STOP);
  }

  return result;
}